

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_backup_step(sqlite3_backup *p,int nPage)

{
  int *piVar1;
  u8 uVar2;
  u32 uVar3;
  sqlite3_mutex *psVar4;
  Btree *pBVar5;
  BtShared *pBVar6;
  BtShared *pBVar7;
  Pager *pPVar8;
  sqlite3_file *psVar9;
  uint uVar10;
  uint uVar11;
  Pgno PVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  DbPage *pSrcPg;
  DbPage *local_60;
  Pager *local_58;
  ulong local_50;
  u32 local_44;
  long local_40;
  Pager *local_38;
  
  psVar4 = p->pSrcDb->mutex;
  if (psVar4 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar4);
  }
  pBVar5 = p->pSrc;
  if ((pBVar5->sharable != '\0') &&
     (pBVar5->wantToLock = pBVar5->wantToLock + 1, pBVar5->locked == '\0')) {
    btreeLockCarefully(pBVar5);
  }
  if ((p->pDestDb != (sqlite3 *)0x0) && (psVar4 = p->pDestDb->mutex, psVar4 != (sqlite3_mutex *)0x0)
     ) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar4);
  }
  uVar10 = p->rc;
  if ((6 < uVar10) || ((0x61U >> (uVar10 & 0x1f) & 1) == 0)) goto LAB_0011b976;
  pBVar5 = p->pSrc;
  local_38 = pBVar5->pBt->pPager;
  local_58 = p->pDest->pBt->pPager;
  if ((p->pDestDb == (sqlite3 *)0x0) || (pBVar5->pBt->inTransaction != '\x02')) {
    uVar11 = 0;
    bVar16 = pBVar5->inTrans != '\0';
    if (!bVar16) {
      uVar11 = btreeBeginTrans(pBVar5,0,(int *)0x0);
    }
    iVar14 = p->bDestLocked;
    if (iVar14 == 0 && uVar11 == 0) {
      iVar14 = sqlite3BtreeSetPageSize(p->pDest,p->pSrc->pBt->pageSize,0,0);
      uVar11 = 7;
      if (iVar14 != 7) {
        iVar14 = p->bDestLocked;
LAB_0011b512:
        uVar11 = 0;
        if ((iVar14 == 0) &&
           (uVar11 = sqlite3BtreeBeginTrans(p->pDest,2,(int *)&p->iDestSchema), uVar11 == 0)) {
          p->bDestLocked = 1;
          uVar11 = 0;
        }
      }
    }
    else if (uVar11 == 0) goto LAB_0011b512;
  }
  else {
    bVar16 = true;
    uVar11 = 5;
  }
  pBVar6 = p->pSrc->pBt;
  uVar3 = pBVar6->pageSize;
  local_50 = (ulong)(int)uVar3;
  pBVar7 = p->pDest->pBt;
  local_44 = pBVar7->pageSize;
  uVar2 = pBVar7->pPager->journalMode;
  if (uVar11 == 0) {
    uVar11 = 0;
    if (uVar2 != '\x05') {
      bVar17 = false;
      if (local_58->tempFile == '\0') {
        bVar17 = local_58->memVfs == '\0';
      }
      if (bVar17) goto LAB_0011b593;
    }
    if (uVar3 != local_44) {
      uVar11 = 8;
    }
  }
LAB_0011b593:
  local_40 = CONCAT71(local_40._1_7_,uVar2);
  uVar10 = pBVar6->nPage;
  if (nPage != 0) {
    PVar12 = p->iNext;
    iVar14 = 1;
    do {
      if ((uVar10 < PVar12) || (uVar11 != 0)) break;
      uVar11 = 0;
      if (PVar12 != (uint)sqlite3PendingByte / p->pSrc->pBt->pageSize + 1) {
        uVar11 = (*local_38->xGet)(local_38,PVar12,&local_60,2);
        if ((uVar11 == 0) &&
           (uVar11 = backupOnePage(p,PVar12,(u8 *)local_60->pData,0), local_60 != (DbPage *)0x0)) {
          sqlite3PagerUnrefNotNull(local_60);
        }
        PVar12 = p->iNext;
      }
      PVar12 = PVar12 + 1;
      p->iNext = PVar12;
      bVar17 = iVar14 < nPage;
      iVar14 = iVar14 + 1;
    } while (bVar17 || nPage < 0);
  }
  if (uVar11 == 0x65) {
LAB_0011b66c:
    if (uVar10 == 0) {
      pBVar5 = p->pDest;
      if ((pBVar5->sharable != '\0') &&
         (pBVar5->wantToLock = pBVar5->wantToLock + 1, pBVar5->locked == '\0')) {
        btreeLockCarefully(pBVar5);
      }
      pBVar6 = pBVar5->pBt;
      pBVar6->nPage = 0;
      uVar11 = newDatabase(pBVar6);
      if (pBVar5->sharable != '\0') {
        piVar1 = &pBVar5->wantToLock;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          unlockBtreeMutex(pBVar5);
        }
      }
      uVar10 = 1;
      if ((uVar11 != 0x65) && (uVar11 != 0)) goto LAB_0011b945;
    }
    uVar11 = sqlite3BtreeUpdateMeta(p->pDest,1,p->iDestSchema + 1);
    if (uVar11 == 0) {
      if (p->pDestDb != (sqlite3 *)0x0) {
        sqlite3ResetAllSchemasOfConnection(p->pDestDb);
      }
      if (((char)local_40 != '\x05') || (uVar11 = sqlite3BtreeSetVersion(p->pDest,2), uVar11 == 0))
      {
        iVar14 = (int)local_50;
        if (iVar14 < (int)local_44) {
          iVar14 = (int)(uVar10 + (int)local_44 / iVar14 + -1) / ((int)local_44 / iVar14);
          PVar12 = iVar14 - (uint)(iVar14 == (uint)sqlite3PendingByte / p->pDest->pBt->pageSize + 1)
          ;
          local_40 = (long)(int)uVar10 * local_50;
          psVar9 = local_58->fd;
          uVar10 = local_58->dbSize;
          if (uVar10 < PVar12) {
LAB_0011b817:
            lVar13 = local_40;
            uVar11 = sqlite3PagerCommitPhaseOne(local_58,(char *)0x0,1);
          }
          else {
            do {
              uVar11 = 0;
              if (((PVar12 != (uint)sqlite3PendingByte / p->pDest->pBt->pageSize + 1) &&
                  (uVar11 = (*local_58->xGet)(local_58,PVar12,&local_60,0), uVar11 == 0)) &&
                 (uVar11 = sqlite3PagerWrite(local_60), local_60 != (DbPage *)0x0)) {
                sqlite3PagerUnrefNotNull(local_60);
              }
            } while ((uVar11 == 0) && (PVar12 = PVar12 + 1, PVar12 <= uVar10));
            lVar13 = local_40;
            if (uVar11 == 0) goto LAB_0011b817;
          }
          lVar15 = (long)(int)(local_44 + sqlite3PendingByte);
          if (lVar13 < (int)(local_44 + sqlite3PendingByte)) {
            lVar15 = lVar13;
          }
          bVar17 = uVar11 == 0;
          if ((bVar17) && (lVar13 = (long)(sqlite3PendingByte + (int)local_50), lVar13 < lVar15)) {
            do {
              local_60 = (DbPage *)0x0;
              uVar11 = (*local_38->xGet)(local_38,(int)(lVar13 / (long)local_50) + 1,&local_60,0);
              if (uVar11 == 0) {
                uVar11 = (*psVar9->pMethods->xWrite)(psVar9,local_60->pData,(int)local_50,lVar13);
              }
              if (local_60 != (DbPage *)0x0) {
                sqlite3PagerUnrefNotNull(local_60);
              }
              bVar17 = uVar11 == 0;
            } while ((bVar17) && (lVar13 = lVar13 + local_50, lVar13 < lVar15));
          }
          if (((!bVar17) ||
              (uVar11 = (*psVar9->pMethods->xFileSize)(psVar9,(sqlite3_int64 *)&local_60),
              uVar11 != 0)) ||
             ((local_40 < (long)local_60 &&
              (uVar11 = (*psVar9->pMethods->xTruncate)(psVar9,local_40), uVar11 != 0))))
          goto LAB_0011b945;
          uVar11 = sqlite3PagerSync(local_58,(char *)0x0);
        }
        else {
          local_58->dbSize =
               (int)((long)((ulong)(uint)(iVar14 >> 0x1f) << 0x20 | local_50 & 0xffffffff) /
                    (long)(int)local_44) * uVar10;
          uVar11 = sqlite3PagerCommitPhaseOne(local_58,(char *)0x0,0);
        }
        if (uVar11 == 0) {
          uVar10 = sqlite3BtreeCommitPhaseTwo(p->pDest,0);
          uVar11 = 0x65;
          if (uVar10 != 0) {
            uVar11 = uVar10;
          }
        }
      }
    }
  }
  else if (uVar11 == 0) {
    p->nPagecount = uVar10;
    p->nRemaining = (uVar10 - p->iNext) + 1;
    if (uVar10 < p->iNext) goto LAB_0011b66c;
    uVar11 = 0;
    if (p->isAttached == 0) {
      pPVar8 = p->pSrc->pBt->pPager;
      p->pNext = pPVar8->pBackup;
      pPVar8->pBackup = p;
      p->isAttached = 1;
    }
  }
LAB_0011b945:
  if (!bVar16) {
    sqlite3BtreeCommitPhaseOne(p->pSrc,(char *)0x0);
    sqlite3BtreeCommitPhaseTwo(p->pSrc,0);
  }
  uVar10 = 7;
  if (uVar11 != 0xc0a) {
    uVar10 = uVar11;
  }
  p->rc = uVar10;
LAB_0011b976:
  if ((p->pDestDb != (sqlite3 *)0x0) && (psVar4 = p->pDestDb->mutex, psVar4 != (sqlite3_mutex *)0x0)
     ) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar4);
  }
  pBVar5 = p->pSrc;
  if (pBVar5->sharable != '\0') {
    piVar1 = &pBVar5->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(pBVar5);
    }
  }
  psVar4 = p->pSrcDb->mutex;
  if (psVar4 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar4);
  }
  return uVar10;
}

Assistant:

SQLITE_API int sqlite3_backup_step(sqlite3_backup *p, int nPage){
  int rc;
  int destMode;       /* Destination journal mode */
  int pgszSrc = 0;    /* Source page size */
  int pgszDest = 0;   /* Destination page size */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( p==0 ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(p->pSrcDb->mutex);
  sqlite3BtreeEnter(p->pSrc);
  if( p->pDestDb ){
    sqlite3_mutex_enter(p->pDestDb->mutex);
  }

  rc = p->rc;
  if( !isFatalError(rc) ){
    Pager * const pSrcPager = sqlite3BtreePager(p->pSrc);     /* Source pager */
    Pager * const pDestPager = sqlite3BtreePager(p->pDest);   /* Dest pager */
    int ii;                            /* Iterator variable */
    int nSrcPage = -1;                 /* Size of source db in pages */
    int bCloseTrans = 0;               /* True if src db requires unlocking */

    /* If the source pager is currently in a write-transaction, return
    ** SQLITE_BUSY immediately.
    */
    if( p->pDestDb && p->pSrc->pBt->inTransaction==TRANS_WRITE ){
      rc = SQLITE_BUSY;
    }else{
      rc = SQLITE_OK;
    }

    /* If there is no open read-transaction on the source database, open
    ** one now. If a transaction is opened here, then it will be closed
    ** before this function exits.
    */
    if( rc==SQLITE_OK && SQLITE_TXN_NONE==sqlite3BtreeTxnState(p->pSrc) ){
      rc = sqlite3BtreeBeginTrans(p->pSrc, 0, 0);
      bCloseTrans = 1;
    }

    /* If the destination database has not yet been locked (i.e. if this
    ** is the first call to backup_step() for the current backup operation),
    ** try to set its page size to the same as the source database. This
    ** is especially important on ZipVFS systems, as in that case it is
    ** not possible to create a database file that uses one page size by
    ** writing to it with another.  */
    if( p->bDestLocked==0 && rc==SQLITE_OK && setDestPgsz(p)==SQLITE_NOMEM ){
      rc = SQLITE_NOMEM;
    }

    /* Lock the destination database, if it is not locked already. */
    if( SQLITE_OK==rc && p->bDestLocked==0
     && SQLITE_OK==(rc = sqlite3BtreeBeginTrans(p->pDest, 2,
                                                (int*)&p->iDestSchema))
    ){
      p->bDestLocked = 1;
    }

    /* Do not allow backup if the destination database is in WAL mode
    ** and the page sizes are different between source and destination */
    pgszSrc = sqlite3BtreeGetPageSize(p->pSrc);
    pgszDest = sqlite3BtreeGetPageSize(p->pDest);
    destMode = sqlite3PagerGetJournalMode(sqlite3BtreePager(p->pDest));
    if( SQLITE_OK==rc
     && (destMode==PAGER_JOURNALMODE_WAL || sqlite3PagerIsMemdb(pDestPager))
     && pgszSrc!=pgszDest
    ){
      rc = SQLITE_READONLY;
    }

    /* Now that there is a read-lock on the source database, query the
    ** source pager for the number of pages in the database.
    */
    nSrcPage = (int)sqlite3BtreeLastPage(p->pSrc);
    assert( nSrcPage>=0 );
    for(ii=0; (nPage<0 || ii<nPage) && p->iNext<=(Pgno)nSrcPage && !rc; ii++){
      const Pgno iSrcPg = p->iNext;                 /* Source page number */
      if( iSrcPg!=PENDING_BYTE_PAGE(p->pSrc->pBt) ){
        DbPage *pSrcPg;                             /* Source page object */
        rc = sqlite3PagerGet(pSrcPager, iSrcPg, &pSrcPg,PAGER_GET_READONLY);
        if( rc==SQLITE_OK ){
          rc = backupOnePage(p, iSrcPg, sqlite3PagerGetData(pSrcPg), 0);
          sqlite3PagerUnref(pSrcPg);
        }
      }
      p->iNext++;
    }
    if( rc==SQLITE_OK ){
      p->nPagecount = nSrcPage;
      p->nRemaining = nSrcPage+1-p->iNext;
      if( p->iNext>(Pgno)nSrcPage ){
        rc = SQLITE_DONE;
      }else if( !p->isAttached ){
        attachBackupObject(p);
      }
    }

    /* Update the schema version field in the destination database. This
    ** is to make sure that the schema-version really does change in
    ** the case where the source and destination databases have the
    ** same schema version.
    */
    if( rc==SQLITE_DONE ){
      if( nSrcPage==0 ){
        rc = sqlite3BtreeNewDb(p->pDest);
        nSrcPage = 1;
      }
      if( rc==SQLITE_OK || rc==SQLITE_DONE ){
        rc = sqlite3BtreeUpdateMeta(p->pDest,1,p->iDestSchema+1);
      }
      if( rc==SQLITE_OK ){
        if( p->pDestDb ){
          sqlite3ResetAllSchemasOfConnection(p->pDestDb);
        }
        if( destMode==PAGER_JOURNALMODE_WAL ){
          rc = sqlite3BtreeSetVersion(p->pDest, 2);
        }
      }
      if( rc==SQLITE_OK ){
        int nDestTruncate;
        /* Set nDestTruncate to the final number of pages in the destination
        ** database. The complication here is that the destination page
        ** size may be different to the source page size.
        **
        ** If the source page size is smaller than the destination page size,
        ** round up. In this case the call to sqlite3OsTruncate() below will
        ** fix the size of the file. However it is important to call
        ** sqlite3PagerTruncateImage() here so that any pages in the
        ** destination file that lie beyond the nDestTruncate page mark are
        ** journalled by PagerCommitPhaseOne() before they are destroyed
        ** by the file truncation.
        */
        assert( pgszSrc==sqlite3BtreeGetPageSize(p->pSrc) );
        assert( pgszDest==sqlite3BtreeGetPageSize(p->pDest) );
        if( pgszSrc<pgszDest ){
          int ratio = pgszDest/pgszSrc;
          nDestTruncate = (nSrcPage+ratio-1)/ratio;
          if( nDestTruncate==(int)PENDING_BYTE_PAGE(p->pDest->pBt) ){
            nDestTruncate--;
          }
        }else{
          nDestTruncate = nSrcPage * (pgszSrc/pgszDest);
        }
        assert( nDestTruncate>0 );

        if( pgszSrc<pgszDest ){
          /* If the source page-size is smaller than the destination page-size,
          ** two extra things may need to happen:
          **
          **   * The destination may need to be truncated, and
          **
          **   * Data stored on the pages immediately following the
          **     pending-byte page in the source database may need to be
          **     copied into the destination database.
          */
          const i64 iSize = (i64)pgszSrc * (i64)nSrcPage;
          sqlite3_file * const pFile = sqlite3PagerFile(pDestPager);
          Pgno iPg;
          int nDstPage;
          i64 iOff;
          i64 iEnd;

          assert( pFile );
          assert( nDestTruncate==0
              || (i64)nDestTruncate*(i64)pgszDest >= iSize || (
                nDestTruncate==(int)(PENDING_BYTE_PAGE(p->pDest->pBt)-1)
             && iSize>=PENDING_BYTE && iSize<=PENDING_BYTE+pgszDest
          ));

          /* This block ensures that all data required to recreate the original
          ** database has been stored in the journal for pDestPager and the
          ** journal synced to disk. So at this point we may safely modify
          ** the database file in any way, knowing that if a power failure
          ** occurs, the original database will be reconstructed from the
          ** journal file.  */
          sqlite3PagerPagecount(pDestPager, &nDstPage);
          for(iPg=nDestTruncate; rc==SQLITE_OK && iPg<=(Pgno)nDstPage; iPg++){
            if( iPg!=PENDING_BYTE_PAGE(p->pDest->pBt) ){
              DbPage *pPg;
              rc = sqlite3PagerGet(pDestPager, iPg, &pPg, 0);
              if( rc==SQLITE_OK ){
                rc = sqlite3PagerWrite(pPg);
                sqlite3PagerUnref(pPg);
              }
            }
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 1);
          }

          /* Write the extra pages and truncate the database file as required */
          iEnd = MIN(PENDING_BYTE + pgszDest, iSize);
          for(
            iOff=PENDING_BYTE+pgszSrc;
            rc==SQLITE_OK && iOff<iEnd;
            iOff+=pgszSrc
          ){
            PgHdr *pSrcPg = 0;
            const Pgno iSrcPg = (Pgno)((iOff/pgszSrc)+1);
            rc = sqlite3PagerGet(pSrcPager, iSrcPg, &pSrcPg, 0);
            if( rc==SQLITE_OK ){
              u8 *zData = sqlite3PagerGetData(pSrcPg);
              rc = sqlite3OsWrite(pFile, zData, pgszSrc, iOff);
            }
            sqlite3PagerUnref(pSrcPg);
          }
          if( rc==SQLITE_OK ){
            rc = backupTruncateFile(pFile, iSize);
          }

          /* Sync the database file to disk. */
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerSync(pDestPager, 0);
          }
        }else{
          sqlite3PagerTruncateImage(pDestPager, nDestTruncate);
          rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 0);
        }

        /* Finish committing the transaction to the destination database. */
        if( SQLITE_OK==rc
         && SQLITE_OK==(rc = sqlite3BtreeCommitPhaseTwo(p->pDest, 0))
        ){
          rc = SQLITE_DONE;
        }
      }
    }

    /* If bCloseTrans is true, then this function opened a read transaction
    ** on the source database. Close the read transaction here. There is
    ** no need to check the return values of the btree methods here, as
    ** "committing" a read-only transaction cannot fail.
    */
    if( bCloseTrans ){
      TESTONLY( int rc2 );
      TESTONLY( rc2  = ) sqlite3BtreeCommitPhaseOne(p->pSrc, 0);
      TESTONLY( rc2 |= ) sqlite3BtreeCommitPhaseTwo(p->pSrc, 0);
      assert( rc2==SQLITE_OK );
    }

    if( rc==SQLITE_IOERR_NOMEM ){
      rc = SQLITE_NOMEM_BKPT;
    }
    p->rc = rc;
  }
  if( p->pDestDb ){
    sqlite3_mutex_leave(p->pDestDb->mutex);
  }
  sqlite3BtreeLeave(p->pSrc);
  sqlite3_mutex_leave(p->pSrcDb->mutex);
  return rc;
}